

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

SoapySDRArgInfo *
SoapySDRDevice_getChannelSettingInfo
          (SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  SoapySDRArgInfo *pSVar1;
  ulong uVar2;
  long lVar3;
  SoapySDRArgInfo *pSVar4;
  SoapySDRArgInfo *pSVar5;
  SoapySDRArgInfo *pSVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> local_b8;
  undefined1 *local_a0;
  ulong *local_98;
  SoapySDRArgInfo local_90;
  
  bVar9 = 0;
  *length = 0;
  local_a0 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *local_a0 = 0;
  *(undefined4 *)(local_a0 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x340))(&local_b8,device,direction,channel);
  pSVar1 = callocArrayType<SoapySDRArgInfo>
                     (((long)local_b8.
                             super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.
                             super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111);
  local_98 = length;
  if (local_b8.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_b8.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
  }
  else {
    lVar7 = 0;
    uVar8 = 0;
    pSVar4 = pSVar1;
    do {
      toArgInfo(&local_90,
                (ArgInfo *)
                ((long)&((local_b8.
                          super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start)->key)._M_dataplus._M_p + lVar7))
      ;
      pSVar5 = &local_90;
      pSVar6 = pSVar4;
      for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
        pSVar6->key = pSVar5->key;
        pSVar5 = (SoapySDRArgInfo *)((long)pSVar5 + (ulong)bVar9 * -0x10 + 8);
        pSVar6 = (SoapySDRArgInfo *)((long)pSVar6 + (ulong)bVar9 * -0x10 + 8);
      }
      uVar8 = uVar8 + 1;
      uVar2 = ((long)local_b8.
                     super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
      pSVar4 = pSVar4 + 1;
      lVar7 = lVar7 + 0xf0;
    } while (uVar8 < uVar2);
  }
  *local_98 = uVar2;
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector(&local_b8);
  return pSVar1;
}

Assistant:

SoapySDRArgInfo *SoapySDRDevice_getChannelSettingInfo(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toArgInfoList(device->getSettingInfo(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}